

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.hpp
# Opt level: O3

void mraa::Iio::private_event_handler(iio_event_data *data,void *args)

{
  int different;
  int channel2;
  int channel;
  int direction;
  int type;
  int modifier;
  int chan_type;
  IioEventData eventData;
  
  if (args != (void *)0x0) {
    mraa_iio_event_extract_event
              (data,&chan_type,&modifier,&type,&direction,&channel,&channel2,&different);
    eventData.channelType = chan_type;
    eventData.modifier = modifier;
    eventData.type = type;
    eventData.direction = direction;
    eventData.channel = channel;
    eventData.channel2 = channel2;
    eventData.diff = different;
    (*(code *)**args)(args);
  }
  return;
}

Assistant:

static void
    private_event_handler(iio_event_data* data, void* args)
    {
        if (args != NULL) {
            IioHandler* handler = (IioHandler*) args;
            IioEventData eventData;
            int chan_type, modifier, type, direction, channel, channel2, different;
            mraa_iio_event_extract_event(data, &chan_type, &modifier, &type, &direction, &channel,
                                         &channel2, &different);
            eventData.channelType = chan_type;
            eventData.modifier = modifier;
            eventData.type = type;
            eventData.direction = direction;
            eventData.channel = channel;
            eventData.channel2 = channel2;
            eventData.diff = different;
            handler->onIioEvent(eventData);
        }
    }